

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void duckdb::QuantileOperation::
     Destroy<duckdb::QuantileState<duckdb::date_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::date_t,_duckdb::QuantileStandardType> *state,
               AggregateInputData *param_2)

{
  _Head_base<0UL,_duckdb::QuantileCursor<duckdb::date_t>_*,_false> __ptr;
  _Head_base<0UL,_duckdb::WindowQuantileState<duckdb::date_t>_*,_false> __ptr_00;
  pointer pdVar1;
  
  __ptr._M_head_impl =
       (state->window_cursor).
       super_unique_ptr<duckdb::QuantileCursor<duckdb::date_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::date_t>_>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::QuantileCursor<duckdb::date_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::date_t>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::QuantileCursor<duckdb::date_t>_*,_std::default_delete<duckdb::QuantileCursor<duckdb::date_t>_>_>
       .super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::date_t>_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (QuantileCursor<duckdb::date_t> *)0x0) {
    ::std::default_delete<duckdb::QuantileCursor<duckdb::date_t>_>::operator()
              ((default_delete<duckdb::QuantileCursor<duckdb::date_t>_> *)&state->window_cursor,
               __ptr._M_head_impl);
  }
  (state->window_cursor).
  super_unique_ptr<duckdb::QuantileCursor<duckdb::date_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::date_t>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::QuantileCursor<duckdb::date_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::date_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::QuantileCursor<duckdb::date_t>_*,_std::default_delete<duckdb::QuantileCursor<duckdb::date_t>_>_>
  .super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::date_t>_*,_false>._M_head_impl =
       (QuantileCursor<duckdb::date_t> *)0x0;
  __ptr_00._M_head_impl =
       (state->window_state).
       super_unique_ptr<duckdb::WindowQuantileState<duckdb::date_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::date_t>_>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::WindowQuantileState<duckdb::date_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::date_t>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowQuantileState<duckdb::date_t>_*,_std::default_delete<duckdb::WindowQuantileState<duckdb::date_t>_>_>
       .super__Head_base<0UL,_duckdb::WindowQuantileState<duckdb::date_t>_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (WindowQuantileState<duckdb::date_t> *)0x0) {
    ::std::default_delete<duckdb::WindowQuantileState<duckdb::date_t>_>::operator()
              ((default_delete<duckdb::WindowQuantileState<duckdb::date_t>_> *)&state->window_state,
               __ptr_00._M_head_impl);
  }
  (state->window_state).
  super_unique_ptr<duckdb::WindowQuantileState<duckdb::date_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::date_t>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowQuantileState<duckdb::date_t>,_std::default_delete<duckdb::WindowQuantileState<duckdb::date_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowQuantileState<duckdb::date_t>_*,_std::default_delete<duckdb::WindowQuantileState<duckdb::date_t>_>_>
  .super__Head_base<0UL,_duckdb::WindowQuantileState<duckdb::date_t>_*,_false>._M_head_impl =
       (WindowQuantileState<duckdb::date_t> *)0x0;
  pdVar1 = (state->v).super_vector<duckdb::date_t,_std::allocator<duckdb::date_t>_>.
           super__Vector_base<duckdb::date_t,_std::allocator<duckdb::date_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &) {
		state.~STATE();
	}